

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::Option(FormattingScene *this,string *name,string *value,FileLoc loc)

{
  bool bVar1;
  string nName;
  string local_60;
  string local_40;
  
  anon_unknown_189::normalizeArg(&local_40,name);
  bVar1 = std::operator==(&local_40,"msereferenceimage");
  if (!bVar1) {
    bVar1 = std::operator==(&local_40,"msereferenceout");
    if (!bVar1) {
      indent_abi_cxx11_(&local_60,this,0);
      Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ("%sOption \"%s\" %s\n",&local_60,name,value);
      goto LAB_0037a613;
    }
  }
  indent_abi_cxx11_(&local_60,this,0);
  Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ("%sOption \"%s\" \"%s\"\n",&local_60,name,value);
LAB_0037a613:
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void FormattingScene::Option(const std::string &name, const std::string &value,
                             FileLoc loc) {
    std::string nName = normalizeArg(name);
    if (nName == "msereferenceimage" || nName == "msereferenceout")
        Printf("%sOption \"%s\" \"%s\"\n", indent(), name, value);
    else
        Printf("%sOption \"%s\" %s\n", indent(), name, value);
}